

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O0

size_t __thiscall
axl::cry::X509Cert::saveDer(X509Cert *this,Array<char,_axl::sl::ArrayDetails<char>_> *buffer)

{
  int iVar1;
  undefined4 extraout_var;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_RSI;
  undefined8 *in_RDI;
  size_t result;
  int length;
  uchar_t *p;
  EVP_PKEY_CTX *local_20;
  Array<char,_axl::sl::ArrayDetails<char>_> *local_18;
  unsigned_long local_8;
  
  local_20 = (EVP_PKEY_CTX *)0x0;
  local_18 = in_RSI;
  iVar1 = i2d_X509((X509 *)*in_RDI,(uchar **)&local_20);
  if (iVar1 < 1) {
    local_8 = failWithLastCryptoError<unsigned_long>(0x151520);
  }
  else {
    iVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                      (local_18,local_20,(EVP_PKEY_CTX *)(long)iVar1);
    CRYPTO_free(local_20);
    local_8 = CONCAT44(extraout_var,iVar1);
  }
  return local_8;
}

Assistant:

size_t
X509Cert::saveDer(sl::Array<char>* buffer) const {
	uchar_t* p = NULL;
	int length = i2d_X509(m_h, &p);
	if (length <= 0)
		return failWithLastCryptoError<size_t>(-1);

	size_t result = buffer->copy((char*)p, length);
	OPENSSL_free(p);
	return result;
}